

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O3

int __thiscall crnlib::cfile_stream::open(cfile_stream *this,char *__file,int __oflag,...)

{
  undefined1 *puVar1;
  int iVar2;
  uint64 uVar3;
  attribs_t in_CX;
  bool in_R8B;
  
  (*(this->super_data_stream)._vptr_data_stream[3])();
  dynamic_string::set(&(this->super_data_stream).m_name,___oflag,0xffffffff);
  this->m_pFile = (FILE *)__file;
  this->m_has_ownership = in_R8B;
  (this->super_data_stream).m_attribs = in_CX;
  uVar3 = ftello64((FILE *)__file);
  this->m_ofs = uVar3;
  fseeko64((FILE *)this->m_pFile,0,2);
  uVar3 = ftello64((FILE *)this->m_pFile);
  this->m_size = uVar3;
  iVar2 = fseeko64((FILE *)this->m_pFile,this->m_ofs,0);
  puVar1 = &(this->super_data_stream).field_0x1a;
  *puVar1 = *puVar1 | 1;
  return (int)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
}

Assistant:

bool open(FILE* pFile, const char* pFilename, uint attribs, bool has_ownership)
        {
            CRNLIB_ASSERT(pFile);
            CRNLIB_ASSERT(pFilename);

            close();

            set_name(pFilename);
            m_pFile = pFile;
            m_has_ownership = has_ownership;
            m_attribs = static_cast<uint16>(attribs);

            m_ofs = crn_ftell(m_pFile);
            crn_fseek(m_pFile, 0, SEEK_END);
            m_size = crn_ftell(m_pFile);
            crn_fseek(m_pFile, m_ofs, SEEK_SET);

            m_opened = true;

            return true;
        }